

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

nng_err nni_aio_sys_init(nng_init_params *params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  nni_aio_expire_q *eq;
  ushort uVar4;
  int i;
  ulong uVar5;
  
  uVar2 = params->max_expire_threads;
  uVar1 = params->num_expire_threads;
  uVar4 = uVar2;
  if ((short)uVar1 < (short)uVar2) {
    uVar4 = uVar1;
  }
  if ((short)uVar2 < 1) {
    uVar4 = uVar1;
  }
  uVar2 = 1;
  if (1 < (short)uVar4) {
    uVar2 = uVar4;
  }
  params->num_expire_threads = uVar2;
  nni_aio_expire_q_list = (nni_aio_expire_q **)nni_zalloc((ulong)((uint)uVar2 * 8));
  nni_aio_expire_q_cnt = (int)uVar2;
  uVar5 = 0;
  while( true ) {
    if (uVar2 == uVar5) {
      return NNG_OK;
    }
    eq = (nni_aio_expire_q *)nni_zalloc(0x120);
    if (eq == (nni_aio_expire_q *)0x0) break;
    nni_mtx_init((nni_mtx *)eq);
    nni_cv_init(&eq->eq_cv,(nni_mtx *)eq);
    nni_list_init_offset(&eq->eq_list,0x1b0);
    eq->eq_next = 0xffffffffffffffff;
    eq->eq_exit = false;
    iVar3 = nni_thr_init(&eq->eq_thr,nni_aio_expire_loop,eq);
    if (iVar3 != 0) {
      nni_aio_expire_q_free(eq);
      break;
    }
    nni_thr_run(&eq->eq_thr);
    nni_aio_expire_q_list[uVar5] = eq;
    uVar5 = uVar5 + 1;
  }
  nni_aio_sys_fini();
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_aio_sys_init(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_expire_threads;
	num_thr = params->num_expire_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 1) {
		num_thr = 1;
	}
	params->num_expire_threads = num_thr;
	nni_aio_expire_q_list =
	    nni_zalloc(sizeof(nni_aio_expire_q *) * num_thr);
	nni_aio_expire_q_cnt = num_thr;
	for (int i = 0; i < num_thr; i++) {
		nni_aio_expire_q *eq;
		if ((eq = nni_aio_expire_q_alloc()) == NULL) {
			nni_aio_sys_fini();
			return (NNG_ENOMEM);
		}
		nni_aio_expire_q_list[i] = eq;
	}

	return (NNG_OK);
}